

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

void Abc_NtkMiterAddOne(Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkMiter)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Abc_Obj_t *pNode_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Abc_Ntk_t *pNtkMiter_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcMiter.c"
                  ,0xeb,"void Abc_NtkMiterAddOne(Abc_Ntk_t *, Abc_Ntk_t *)");
  }
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pNode_00 = Abc_NtkObj(pNtk,local_24);
    if ((pNode_00 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pNode_00), iVar1 != 0)) {
      pMan = (Abc_Aig_t *)pNtkMiter->pManFunc;
      pAVar2 = Abc_ObjChild0Copy(pNode_00);
      p1 = Abc_ObjChild1Copy(pNode_00);
      pAVar2 = Abc_AigAnd(pMan,pAVar2,p1);
      (pNode_00->field_6).pCopy = pAVar2;
    }
  }
  return;
}

Assistant:

void Abc_NtkMiterAddOne( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkMiter )
{
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    Abc_AigForEachAnd( pNtk, pNode, i )
        pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}